

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_validate_file(mz_zip_archive *pZip,mz_uint file_index,mz_uint flags)

{
  long lVar1;
  uint uVar2;
  mz_zip_internal_state *pmVar3;
  bool bVar4;
  uint uVar5;
  void *__s2;
  mz_bool mVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  uint uVar14;
  mz_uint8 *pCentral_dir_header;
  mz_zip_error mVar15;
  short *psVar16;
  mz_uint32 uncomp_crc32;
  mz_bool found_zip64_ext_data_in_cdir;
  mz_zip_array file_data_array;
  mz_uint32 local_header_u32 [8];
  mz_uint8 descriptor_buf [32];
  mz_zip_archive_file_stat file_stat;
  ulong local_530;
  uint local_524;
  ulong local_520;
  ulong local_518;
  uint local_510;
  mz_bool local_50c;
  mz_zip_array local_508;
  ulong local_4e0;
  int local_4d8;
  ushort local_4d2;
  uint local_4ca;
  uint local_4c6;
  uint local_4c2;
  ushort local_4be;
  ushort local_4bc;
  mz_uint64 local_4b8;
  long local_4b0;
  uint local_4a8;
  uint local_4a4;
  uint local_4a0;
  ulong auStack_49c [2];
  mz_zip_archive_file_stat local_488;
  
  local_50c = 0;
  local_524 = 0;
  local_508.m_capacity = 0;
  local_508.m_p = (short *)0x0;
  local_508.m_size = 0;
  local_508.m_element_size = 1;
  local_508._28_4_ = 0;
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar3 = pZip->m_pState;
  if ((((pmVar3 == (mz_zip_internal_state *)0x0) || (pZip->m_pAlloc == (mz_alloc_func)0x0)) ||
      (pZip->m_pFree == (mz_free_func)0x0)) || (pZip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
LAB_001088c7:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (pZip->m_total_files < file_index) goto LAB_001088c7;
  if (file_index < pZip->m_total_files) {
    pCentral_dir_header =
         (mz_uint8 *)
         ((ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
         (long)(pmVar3->m_central_dir).m_p);
  }
  else {
    pCentral_dir_header = (mz_uint8 *)0x0;
  }
  mVar6 = mz_zip_file_stat_internal(pZip,file_index,pCentral_dir_header,&local_488,&local_50c);
  if (mVar6 == 0) {
    return 0;
  }
  if (local_488.m_is_directory != 0) {
    return 1;
  }
  if (local_488.m_uncomp_size == 0) {
    return 1;
  }
  if (local_488.m_is_encrypted != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if ((local_488.m_method & 0xfff7) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  if (local_488.m_is_supported == 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
    return 0;
  }
  sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_488.m_local_header_ofs,&local_4d8,0x1e);
  if (sVar9 != 0x1e) {
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_4d8 != 0x4034b50) {
LAB_001089f3:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar10 = (ulong)local_4be;
  local_530 = (ulong)local_4bc;
  local_520 = (ulong)local_4c6;
  local_518 = (ulong)local_4c2;
  local_510 = (uint)local_4d2;
  sVar11 = strlen(local_488.m_filename);
  if (sVar11 != uVar10) goto LAB_001089f3;
  local_4b8 = local_488.m_local_header_ofs + uVar10 + 0x1e;
  local_4b0 = local_4b8 + local_530;
  if (pZip->m_archive_size < local_488.m_comp_size + local_4b0) goto LAB_001089f3;
  uVar13 = local_530;
  if (local_4bc < local_4be) {
    uVar13 = uVar10;
  }
  if ((local_508.m_capacity < uVar13) &&
     (local_4e0 = uVar13, mVar6 = mz_zip_array_ensure_capacity(pZip,&local_508,uVar13,0),
     uVar13 = local_4e0, mVar6 == 0)) {
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  __s2 = local_508.m_p;
  local_508.m_size = uVar13;
  if (uVar10 == 0) {
LAB_00108ab8:
    psVar16 = (short *)local_508.m_p;
    bVar4 = false;
    if (local_4bc != 0) {
      if ((int)local_518 == -1 || (int)local_520 == -1) {
        sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_4b8,local_508.m_p,local_530);
        if (sVar9 == local_530) {
          bVar4 = false;
          do {
            if ((uint)local_530 < 4) {
LAB_00108b2e:
              pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
              iVar8 = 1;
            }
            else {
              lVar1 = (ulong)(ushort)psVar16[1] + 4;
              uVar14 = (uint)lVar1;
              if ((uint)local_530 < uVar14) goto LAB_00108b2e;
              if (*psVar16 == 1) {
                if ((ushort)psVar16[1] < 0x10) {
                  pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                  iVar8 = 2;
                }
                else {
                  local_518 = *(ulong *)(psVar16 + 2);
                  local_520 = *(ulong *)(psVar16 + 6);
                  bVar4 = true;
                  iVar8 = 3;
                }
              }
              else {
                psVar16 = (short *)((long)psVar16 + lVar1);
                iVar8 = 0;
                local_530 = (ulong)((uint)local_530 - uVar14);
              }
            }
            iVar7 = 0;
            if (iVar8 != 0) {
              if (iVar8 != 3) {
                iVar7 = iVar8;
              }
              break;
            }
          } while ((uint)local_530 != 0);
        }
        else {
          pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
          bVar4 = false;
          iVar7 = 2;
        }
        if (iVar7 == 2) goto LAB_00108d67;
        if (iVar7 != 0) {
          return 0;
        }
      }
    }
    if ((local_4ca == 0 && local_520 == 0) && (local_510 & 8) != 0) {
      sVar9 = (ulong)(pmVar3->m_zip64 != 0 || bVar4) * 8 + 0x10;
      sVar12 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_4b0 + local_488.m_comp_size,&local_4a8,
                                sVar9);
      mVar15 = MZ_ZIP_FILE_READ_FAILED;
      if (sVar12 == sVar9) {
        uVar14 = local_4a4;
        uVar5 = local_4a8;
        if (local_4a8 == 0x8074b50) {
          uVar14 = local_4a0;
          uVar5 = local_4a4;
        }
        uVar13 = (ulong)uVar14;
        uVar2 = *(uint *)((long)auStack_49c + (ulong)(local_4a8 == 0x8074b50) * 4 + -4);
        uVar10 = (ulong)uVar2;
        if (bVar4 || pmVar3->m_zip64 != 0) {
          uVar13 = CONCAT44(uVar2,uVar14);
          uVar10 = *(ulong *)((long)auStack_49c + (ulong)(local_4a8 == 0x8074b50) * 4);
        }
        mVar15 = MZ_ZIP_VALIDATION_FAILED;
        if (((uVar5 == local_488.m_crc32) && (uVar13 == local_488.m_comp_size)) &&
           (uVar10 == local_488.m_uncomp_size)) goto LAB_00108cf5;
      }
      pZip->m_last_error = mVar15;
      goto LAB_00108d67;
    }
    if (((local_4ca == local_488.m_crc32) && (local_520 == local_488.m_comp_size)) &&
       (local_518 == local_488.m_uncomp_size)) {
LAB_00108cf5:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_508.m_p);
      local_508.m_capacity = 0;
      local_508.m_element_size = 0;
      local_508._28_4_ = 0;
      local_508.m_p = (void *)0x0;
      local_508.m_size = 0;
      if ((flags >> 0xd & 1) != 0) {
        return 1;
      }
      mVar6 = mz_zip_reader_extract_to_callback
                        (pZip,file_index,mz_zip_compute_crc32_callback,&local_524,0);
      if (mVar6 != 0) {
        if (local_524 != local_488.m_crc32) {
          pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
          return 0;
        }
        return 1;
      }
      return 0;
    }
  }
  else {
    sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_488.m_local_header_ofs + 0x1e,local_508.m_p,
                             uVar10);
    if (sVar9 != uVar10) {
      pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      goto LAB_00108d67;
    }
    iVar7 = bcmp(local_488.m_filename,__s2,uVar10);
    if (iVar7 == 0) goto LAB_00108ab8;
  }
  pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
LAB_00108d67:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_508.m_p);
  return 0;
}

Assistant:

mz_bool mz_zip_validate_file(mz_zip_archive *pZip, mz_uint file_index, mz_uint flags)
{
    mz_zip_archive_file_stat file_stat;
    mz_zip_internal_state *pState;
    const mz_uint8 *pCentral_dir_header;
    mz_bool found_zip64_ext_data_in_cdir = MZ_FALSE;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint64 local_header_ofs = 0;
    mz_uint32 local_header_filename_len, local_header_extra_len, local_header_crc32;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_uint32 uncomp_crc32 = MZ_CRC32_INIT;
    mz_bool has_data_descriptor;
    mz_uint32 local_header_bit_flags;

    mz_zip_array file_data_array;
    mz_zip_array_init(&file_data_array, 1);

    if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (file_index > pZip->m_total_files)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    pCentral_dir_header = mz_zip_get_cdh(pZip, file_index);

    if (!mz_zip_file_stat_internal(pZip, file_index, pCentral_dir_header, &file_stat, &found_zip64_ext_data_in_cdir))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_uncomp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_is_encrypted)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports stored and deflate. */
    if ((file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    if (!file_stat.m_is_supported)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

    /* Read and parse the local directory entry. */
    local_header_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    local_header_filename_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    local_header_crc32 = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_CRC32_OFS);
    local_header_bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    has_data_descriptor = (local_header_bit_flags & 8) != 0;

    if (local_header_filename_len != strlen(file_stat.m_filename))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if (!mz_zip_array_resize(pZip, &file_data_array, MZ_MAX(local_header_filename_len, local_header_extra_len), MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if (local_header_filename_len)
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE, file_data_array.m_p, local_header_filename_len) != local_header_filename_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        /* I've seen 1 archive that had the same pathname, but used backslashes in the local dir and forward slashes in the central dir. Do we care about this? For now, this case will fail validation. */
        if (memcmp(file_stat.m_filename, file_data_array.m_p, local_header_filename_len) != 0)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_uint32 extra_size_remaining = local_header_extra_len;
        const mz_uint8 *pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                    goto handle_failure;
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64));

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);
    }

    /* TODO: parse local header extra data when local_header_comp_size is 0xFFFFFFFF! (big_descriptor.zip) */
    /* I've seen zips in the wild with the data descriptor bit set, but proper local header values and bogus data descriptors */
    if ((has_data_descriptor) && (!local_header_comp_size) && (!local_header_crc32))
    {
        mz_uint8 descriptor_buf[32];
        mz_bool has_id;
        const mz_uint8 *pSrc;
        mz_uint32 file_crc32;
        mz_uint64 comp_size = 0, uncomp_size = 0;

        mz_uint32 num_descriptor_uint32s = ((pState->m_zip64) || (found_zip64_ext_data_in_ldir)) ? 6 : 4;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size, descriptor_buf, sizeof(mz_uint32) * num_descriptor_uint32s) != (sizeof(mz_uint32) * num_descriptor_uint32s))
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        has_id = (MZ_READ_LE32(descriptor_buf) == MZ_ZIP_DATA_DESCRIPTOR_ID);
        pSrc = has_id ? (descriptor_buf + sizeof(mz_uint32)) : descriptor_buf;

        file_crc32 = MZ_READ_LE32(pSrc);

        if ((pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            comp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32) + sizeof(mz_uint64));
        }
        else
        {
            comp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32) + sizeof(mz_uint32));
        }

        if ((file_crc32 != file_stat.m_crc32) || (comp_size != file_stat.m_comp_size) || (uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }
    else
    {
        if ((local_header_crc32 != file_stat.m_crc32) || (local_header_comp_size != file_stat.m_comp_size) || (local_header_uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    mz_zip_array_clear(pZip, &file_data_array);

    if ((flags & MZ_ZIP_FLAG_VALIDATE_HEADERS_ONLY) == 0)
    {
        if (!mz_zip_reader_extract_to_callback(pZip, file_index, mz_zip_compute_crc32_callback, &uncomp_crc32, 0))
            return MZ_FALSE;

        /* 1 more check to be sure, although the extract checks too. */
        if (uncomp_crc32 != file_stat.m_crc32)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            return MZ_FALSE;
        }
    }

    return MZ_TRUE;

handle_failure:
    mz_zip_array_clear(pZip, &file_data_array);
    return MZ_FALSE;
}